

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

bool * __thiscall
google::protobuf::internal::UntypedMapBase::GetKey<bool>(UntypedMapBase *this,NodeBase *node)

{
  Nullable<const_char_*> failure_msg;
  LogMessageFatal LStack_18;
  
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                          (0,(byte)(this->type_info_).field_0x3 & 0xf,
                           "static_cast<int>(StaticTypeKind<T>()) == static_cast<int>(type_info_.key_type)"
                          );
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    return (bool *)(node + 1);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,0x146,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

T* GetKey(NodeBase* node) const {
    // Debug check that `T` matches what we expect from the type info.
    ABSL_DCHECK_EQ(static_cast<int>(StaticTypeKind<T>()),
                   static_cast<int>(type_info_.key_type));
    return reinterpret_cast<T*>(node->GetVoidKey());
  }